

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O0

void __thiscall
t_py_generator::generate_process_function
          (t_py_generator *this,t_service *tservice,t_function *tfunction)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  string *psVar4;
  t_struct *ptVar5;
  t_type *ptVar6;
  reference pptVar7;
  string local_f00 [32];
  string local_ee0;
  string local_ec0;
  string local_ea0;
  string local_e80;
  string local_e60;
  string local_e40;
  string local_e20 [32];
  string local_e00;
  string local_de0 [32];
  string local_dc0;
  string local_da0 [32];
  string local_d80;
  string local_d60;
  string local_d40 [32];
  string local_d20;
  string local_d00 [32];
  string local_ce0;
  string local_cc0 [32];
  string local_ca0;
  string local_c80;
  string local_c60;
  string local_c40;
  string local_c20;
  string local_c00;
  string *local_be0;
  string *xname_2;
  t_field **local_bd0;
  string local_bc8 [32];
  string local_ba8;
  string local_b88;
  string local_b68;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_b48
  ;
  t_field **local_b40;
  byte local_b31;
  undefined1 local_b30 [7];
  bool first_2;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_b10
  ;
  const_iterator f_iter_2;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields_2;
  t_struct *arg_struct_2;
  string local_ad8;
  string local_ab8;
  string local_a98;
  string local_a78;
  string local_a58 [32];
  string local_a38;
  string local_a18;
  string local_9f8 [32];
  string local_9d8;
  string local_9b8 [32];
  string local_998;
  string local_978 [32];
  string local_958;
  string local_938;
  string local_918 [32];
  string local_8f8;
  string local_8d8 [32];
  string local_8b8;
  string local_898 [32];
  string local_878;
  string local_858;
  string local_838 [32];
  string local_818;
  string local_7f8;
  string local_7d8 [32];
  string local_7b8;
  string local_798;
  string local_778;
  string *local_758;
  string *xname_1;
  t_field **local_748;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_740
  ;
  t_field **local_738;
  byte local_729;
  undefined1 local_728 [7];
  bool first_1;
  string local_708;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_6e8
  ;
  const_iterator f_iter_1;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields_1;
  t_struct *arg_struct_1;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0 [32];
  string local_5d0;
  string local_5b0 [32];
  string local_590;
  string local_570 [32];
  string local_550;
  string local_530;
  string local_510 [32];
  string local_4f0;
  string local_4d0 [32];
  string local_4b0;
  string local_490 [32];
  string local_470;
  string local_450;
  string local_430 [32];
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string *local_370;
  string *xname;
  t_field **local_360;
  string local_358 [32];
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_1b8
  ;
  t_field **local_1b0;
  byte local_1a1;
  undefined1 local_1a0 [7];
  bool first;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_180
  ;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *arg_struct;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_148
  ;
  const_iterator x_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *xceptions;
  t_struct *xs;
  string local_110;
  string local_f0;
  undefined1 local_d0 [8];
  string resultname;
  string argsname;
  string local_70;
  string local_40;
  t_function *local_20;
  t_function *tfunction_local;
  t_service *tservice_local;
  t_py_generator *this_local;
  
  local_20 = tfunction;
  tfunction_local = (t_function *)tservice;
  tservice_local = (t_service *)this;
  if ((this->gen_tornado_ & 1U) == 0) {
    t_generator::indent_abi_cxx11_
              ((string *)(argsname.field_2._M_local_buf + 8),&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)&this->f_service_,
                             (string *)(argsname.field_2._M_local_buf + 8));
    poVar3 = std::operator<<(poVar3,"def process_");
    psVar4 = t_function::get_name_abi_cxx11_(local_20);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    poVar3 = std::operator<<(poVar3,"(self, seqid, iprot, oprot):");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)(argsname.field_2._M_local_buf + 8));
  }
  else {
    t_generator::indent_abi_cxx11_(&local_40,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_40);
    poVar3 = std::operator<<(poVar3,"@gen.coroutine");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
    poVar3 = std::operator<<(poVar3,(string *)&local_70);
    poVar3 = std::operator<<(poVar3,"def process_");
    psVar4 = t_function::get_name_abi_cxx11_(local_20);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    poVar3 = std::operator<<(poVar3,"(self, seqid, iprot, oprot):");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_40);
  }
  t_generator::indent_up(&this->super_t_generator);
  psVar4 = t_function::get_name_abi_cxx11_(local_20);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&resultname.field_2 + 8),psVar4,"_args");
  psVar4 = t_function::get_name_abi_cxx11_(local_20);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 psVar4,"_result");
  t_generator::indent_abi_cxx11_(&local_f0,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_f0);
  poVar3 = std::operator<<(poVar3,"args = ");
  poVar3 = std::operator<<(poVar3,(string *)(resultname.field_2._M_local_buf + 8));
  poVar3 = std::operator<<(poVar3,"()");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_110,&this->super_t_generator);
  poVar3 = std::operator<<(poVar3,(string *)&local_110);
  poVar3 = std::operator<<(poVar3,"args.read(iprot)");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)&xs,&this->super_t_generator);
  poVar3 = std::operator<<(poVar3,(string *)&xs);
  poVar3 = std::operator<<(poVar3,"iprot.readMessageEnd()");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&xs);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  ptVar5 = t_function::get_xceptions(local_20);
  x_iter._M_current = (t_field **)t_struct::get_members(ptVar5);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_148);
  bVar1 = t_function::is_oneway(local_20);
  if (!bVar1) {
    t_generator::indent_abi_cxx11_((string *)&arg_struct,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&arg_struct);
    poVar3 = std::operator<<(poVar3,"result = ");
    poVar3 = std::operator<<(poVar3,(string *)local_d0);
    poVar3 = std::operator<<(poVar3,"()");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&arg_struct);
  }
  if ((this->gen_twisted_ & 1U) == 0) {
    if ((this->gen_tornado_ & 1U) == 0) {
      t_generator::indent_abi_cxx11_((string *)&arg_struct_2,&this->super_t_generator);
      poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&arg_struct_2);
      poVar3 = std::operator<<(poVar3,"try:");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&arg_struct_2);
      t_generator::indent_up(&this->super_t_generator);
      ptVar5 = t_function::get_arglist(local_20);
      f_iter_2._M_current = (t_field **)t_struct::get_members(ptVar5);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      __normal_iterator(&local_b10);
      t_generator::indent_abi_cxx11_((string *)local_b30,&this->super_t_generator);
      std::operator<<((ostream *)&this->f_service_,(string *)local_b30);
      std::__cxx11::string::~string((string *)local_b30);
      bVar1 = t_function::is_oneway(local_20);
      if (!bVar1) {
        ptVar6 = t_function::get_returntype(local_20);
        uVar2 = (*(ptVar6->super_t_doc)._vptr_t_doc[4])();
        if ((uVar2 & 1) == 0) {
          std::operator<<((ostream *)&this->f_service_,"result.success = ");
        }
      }
      poVar3 = std::operator<<((ostream *)&this->f_service_,"self._handler.");
      psVar4 = t_function::get_name_abi_cxx11_(local_20);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      std::operator<<(poVar3,"(");
      local_b31 = 1;
      local_b40 = (t_field **)
                  std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter_2._M_current);
      local_b10._M_current = local_b40;
      while( true ) {
        local_b48._M_current =
             (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter_2._M_current);
        bVar1 = __gnu_cxx::operator!=(&local_b10,&local_b48);
        if (!bVar1) break;
        if ((local_b31 & 1) == 0) {
          std::operator<<((ostream *)&this->f_service_,", ");
        }
        else {
          local_b31 = 0;
        }
        poVar3 = std::operator<<((ostream *)&this->f_service_,"args.");
        pptVar7 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_b10);
        psVar4 = t_field::get_name_abi_cxx11_(*pptVar7);
        std::operator<<(poVar3,(string *)psVar4);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_b10);
      }
      poVar3 = std::operator<<((ostream *)&this->f_service_,")");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      bVar1 = t_function::is_oneway(local_20);
      if (!bVar1) {
        t_generator::indent_abi_cxx11_(&local_b68,&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_b68);
        poVar3 = std::operator<<(poVar3,"msg_type = TMessageType.REPLY");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_b68);
      }
      t_generator::indent_down(&this->super_t_generator);
      t_generator::indent_abi_cxx11_(&local_b88,&this->super_t_generator);
      poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_b88);
      poVar3 = std::operator<<(poVar3,"except TTransport.TTransportException:");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_ba8,&this->super_t_generator);
      poVar3 = std::operator<<(poVar3,(string *)&local_ba8);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_bc8);
      poVar3 = std::operator<<(poVar3,local_bc8);
      poVar3 = std::operator<<(poVar3,"raise");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string(local_bc8);
      std::__cxx11::string::~string((string *)&local_ba8);
      std::__cxx11::string::~string((string *)&local_b88);
      bVar1 = t_function::is_oneway(local_20);
      if (bVar1) {
        t_generator::indent_abi_cxx11_(&local_ec0,&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_ec0);
        poVar3 = std::operator<<(poVar3,"except Exception:");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_ee0,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_ee0);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_f00);
        poVar3 = std::operator<<(poVar3,local_f00);
        poVar3 = std::operator<<(poVar3,"logging.exception(\'Exception in oneway handler\')");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string(local_f00);
        std::__cxx11::string::~string((string *)&local_ee0);
        std::__cxx11::string::~string((string *)&local_ec0);
      }
      else {
        local_bd0 = (t_field **)
                    std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(x_iter._M_current);
        local_148._M_current = local_bd0;
        while( true ) {
          xname_2 = (string *)
                    std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                              ((vector<t_field_*,_std::allocator<t_field_*>_> *)x_iter._M_current);
          bVar1 = __gnu_cxx::operator!=
                            (&local_148,
                             (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)&xname_2);
          if (!bVar1) break;
          pptVar7 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&local_148);
          local_be0 = t_field::get_name_abi_cxx11_(*pptVar7);
          t_generator::indent_abi_cxx11_(&local_c00,&this->super_t_generator);
          poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_c00);
          poVar3 = std::operator<<(poVar3,"except ");
          pptVar7 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&local_148);
          ptVar6 = t_field::get_type(*pptVar7);
          type_name_abi_cxx11_(&local_c20,this,ptVar6);
          poVar3 = std::operator<<(poVar3,(string *)&local_c20);
          poVar3 = std::operator<<(poVar3," as ");
          poVar3 = std::operator<<(poVar3,(string *)local_be0);
          poVar3 = std::operator<<(poVar3,":");
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_c20);
          std::__cxx11::string::~string((string *)&local_c00);
          t_generator::indent_up(&this->super_t_generator);
          t_generator::indent_abi_cxx11_(&local_c40,&this->super_t_generator);
          poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_c40);
          poVar3 = std::operator<<(poVar3,"msg_type = TMessageType.REPLY");
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_c40);
          t_generator::indent_abi_cxx11_(&local_c60,&this->super_t_generator);
          poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_c60);
          poVar3 = std::operator<<(poVar3,"result.");
          poVar3 = std::operator<<(poVar3,(string *)local_be0);
          poVar3 = std::operator<<(poVar3," = ");
          poVar3 = std::operator<<(poVar3,(string *)local_be0);
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_c60);
          t_generator::indent_down(&this->super_t_generator);
          __gnu_cxx::
          __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
          operator++(&local_148);
        }
        t_generator::indent_abi_cxx11_(&local_c80,&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_c80);
        poVar3 = std::operator<<(poVar3,"except TApplicationException as ex:");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_ca0,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_ca0);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_cc0);
        poVar3 = std::operator<<(poVar3,local_cc0);
        poVar3 = std::operator<<(poVar3,"logging.exception(\'TApplication exception in handler\')");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_ce0,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_ce0);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_d00);
        poVar3 = std::operator<<(poVar3,local_d00);
        poVar3 = std::operator<<(poVar3,"msg_type = TMessageType.EXCEPTION");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_d20,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_d20);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_d40);
        poVar3 = std::operator<<(poVar3,local_d40);
        poVar3 = std::operator<<(poVar3,"result = ex");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_d60,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_d60);
        poVar3 = std::operator<<(poVar3,"except Exception:");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_d80,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_d80);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_da0);
        poVar3 = std::operator<<(poVar3,local_da0);
        poVar3 = std::operator<<(poVar3,"logging.exception(\'Unexpected exception in handler\')");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_dc0,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_dc0);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_de0);
        poVar3 = std::operator<<(poVar3,local_de0);
        poVar3 = std::operator<<(poVar3,"msg_type = TMessageType.EXCEPTION");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_e00,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_e00);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_e20);
        poVar3 = std::operator<<(poVar3,local_e20);
        poVar3 = std::operator<<(poVar3,
                                 "result = TApplicationException(TApplicationException.INTERNAL_ERROR, \'Internal error\')"
                                );
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_e40,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_e40);
        poVar3 = std::operator<<(poVar3,"oprot.writeMessageBegin(\"");
        psVar4 = t_function::get_name_abi_cxx11_(local_20);
        poVar3 = std::operator<<(poVar3,(string *)psVar4);
        poVar3 = std::operator<<(poVar3,"\", msg_type, seqid)");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_e60,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_e60);
        poVar3 = std::operator<<(poVar3,"result.write(oprot)");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_e80,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_e80);
        poVar3 = std::operator<<(poVar3,"oprot.writeMessageEnd()");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_ea0,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_ea0);
        poVar3 = std::operator<<(poVar3,"oprot.trans.flush()");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_ea0);
        std::__cxx11::string::~string((string *)&local_e80);
        std::__cxx11::string::~string((string *)&local_e60);
        std::__cxx11::string::~string((string *)&local_e40);
        std::__cxx11::string::~string(local_e20);
        std::__cxx11::string::~string((string *)&local_e00);
        std::__cxx11::string::~string(local_de0);
        std::__cxx11::string::~string((string *)&local_dc0);
        std::__cxx11::string::~string(local_da0);
        std::__cxx11::string::~string((string *)&local_d80);
        std::__cxx11::string::~string((string *)&local_d60);
        std::__cxx11::string::~string(local_d40);
        std::__cxx11::string::~string((string *)&local_d20);
        std::__cxx11::string::~string(local_d00);
        std::__cxx11::string::~string((string *)&local_ce0);
        std::__cxx11::string::~string(local_cc0);
        std::__cxx11::string::~string((string *)&local_ca0);
        std::__cxx11::string::~string((string *)&local_c80);
      }
      t_generator::indent_down(&this->super_t_generator);
    }
    else {
      ptVar5 = t_function::get_arglist(local_20);
      f_iter_1._M_current = (t_field **)t_struct::get_members(ptVar5);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      __normal_iterator(&local_6e8);
      bVar1 = t_function::is_oneway(local_20);
      if (!bVar1) {
        poVar3 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_service_);
        poVar3 = std::operator<<(poVar3,"msg_type = TMessageType.REPLY");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      }
      t_generator::indent_abi_cxx11_(&local_708,&this->super_t_generator);
      poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_708);
      poVar3 = std::operator<<(poVar3,"try:");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_708);
      t_generator::indent_up(&this->super_t_generator);
      t_generator::indent_abi_cxx11_((string *)local_728,&this->super_t_generator);
      std::operator<<((ostream *)&this->f_service_,(string *)local_728);
      std::__cxx11::string::~string((string *)local_728);
      bVar1 = t_function::is_oneway(local_20);
      if (!bVar1) {
        ptVar6 = t_function::get_returntype(local_20);
        uVar2 = (*(ptVar6->super_t_doc)._vptr_t_doc[4])();
        if ((uVar2 & 1) == 0) {
          std::operator<<((ostream *)&this->f_service_,"result.success = ");
        }
      }
      poVar3 = std::operator<<((ostream *)&this->f_service_,"yield gen.maybe_future(self._handler.")
      ;
      psVar4 = t_function::get_name_abi_cxx11_(local_20);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      std::operator<<(poVar3,"(");
      local_729 = 1;
      local_738 = (t_field **)
                  std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter_1._M_current);
      local_6e8._M_current = local_738;
      while( true ) {
        local_740._M_current =
             (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter_1._M_current);
        bVar1 = __gnu_cxx::operator!=(&local_6e8,&local_740);
        if (!bVar1) break;
        if ((local_729 & 1) == 0) {
          std::operator<<((ostream *)&this->f_service_,", ");
        }
        else {
          local_729 = 0;
        }
        poVar3 = std::operator<<((ostream *)&this->f_service_,"args.");
        pptVar7 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_6e8);
        psVar4 = t_field::get_name_abi_cxx11_(*pptVar7);
        std::operator<<(poVar3,(string *)psVar4);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_6e8);
      }
      poVar3 = std::operator<<((ostream *)&this->f_service_,"))");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_down(&this->super_t_generator);
      bVar1 = t_function::is_oneway(local_20);
      if (!bVar1) {
        local_748 = (t_field **)
                    std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(x_iter._M_current);
        local_148._M_current = local_748;
        while( true ) {
          xname_1 = (string *)
                    std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                              ((vector<t_field_*,_std::allocator<t_field_*>_> *)x_iter._M_current);
          bVar1 = __gnu_cxx::operator!=
                            (&local_148,
                             (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)&xname_1);
          if (!bVar1) break;
          pptVar7 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&local_148);
          local_758 = t_field::get_name_abi_cxx11_(*pptVar7);
          t_generator::indent_abi_cxx11_(&local_778,&this->super_t_generator);
          poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_778);
          poVar3 = std::operator<<(poVar3,"except ");
          pptVar7 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&local_148);
          ptVar6 = t_field::get_type(*pptVar7);
          type_name_abi_cxx11_(&local_798,this,ptVar6);
          poVar3 = std::operator<<(poVar3,(string *)&local_798);
          poVar3 = std::operator<<(poVar3," as ");
          poVar3 = std::operator<<(poVar3,(string *)local_758);
          poVar3 = std::operator<<(poVar3,":");
          poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          t_generator::indent_abi_cxx11_(&local_7b8,&this->super_t_generator);
          poVar3 = std::operator<<(poVar3,(string *)&local_7b8);
          (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_7d8);
          poVar3 = std::operator<<(poVar3,local_7d8);
          poVar3 = std::operator<<(poVar3,"result.");
          poVar3 = std::operator<<(poVar3,(string *)local_758);
          poVar3 = std::operator<<(poVar3," = ");
          poVar3 = std::operator<<(poVar3,(string *)local_758);
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string(local_7d8);
          std::__cxx11::string::~string((string *)&local_7b8);
          std::__cxx11::string::~string((string *)&local_798);
          std::__cxx11::string::~string((string *)&local_778);
          __gnu_cxx::
          __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
          operator++(&local_148);
        }
      }
      t_generator::indent_abi_cxx11_(&local_7f8,&this->super_t_generator);
      poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_7f8);
      poVar3 = std::operator<<(poVar3,"except TTransport.TTransportException:");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_818,&this->super_t_generator);
      poVar3 = std::operator<<(poVar3,(string *)&local_818);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_838);
      poVar3 = std::operator<<(poVar3,local_838);
      poVar3 = std::operator<<(poVar3,"raise");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string(local_838);
      std::__cxx11::string::~string((string *)&local_818);
      std::__cxx11::string::~string((string *)&local_7f8);
      bVar1 = t_function::is_oneway(local_20);
      if (bVar1) {
        t_generator::indent_abi_cxx11_(&local_a18,&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_a18);
        poVar3 = std::operator<<(poVar3,"except Exception:");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_a38,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_a38);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_a58);
        poVar3 = std::operator<<(poVar3,local_a58);
        poVar3 = std::operator<<(poVar3,"logging.exception(\'Exception in oneway handler\')");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string(local_a58);
        std::__cxx11::string::~string((string *)&local_a38);
        std::__cxx11::string::~string((string *)&local_a18);
      }
      else {
        t_generator::indent_abi_cxx11_(&local_858,&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_858);
        poVar3 = std::operator<<(poVar3,"except TApplicationException as ex:");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_878,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_878);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_898);
        poVar3 = std::operator<<(poVar3,local_898);
        poVar3 = std::operator<<(poVar3,"logging.exception(\'TApplication exception in handler\')");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_8b8,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_8b8);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_8d8);
        poVar3 = std::operator<<(poVar3,local_8d8);
        poVar3 = std::operator<<(poVar3,"msg_type = TMessageType.EXCEPTION");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_8f8,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_8f8);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_918);
        poVar3 = std::operator<<(poVar3,local_918);
        poVar3 = std::operator<<(poVar3,"result = ex");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_938,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_938);
        poVar3 = std::operator<<(poVar3,"except Exception:");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_958,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_958);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_978);
        poVar3 = std::operator<<(poVar3,local_978);
        poVar3 = std::operator<<(poVar3,"logging.exception(\'Unexpected exception in handler\')");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_998,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_998);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_9b8);
        poVar3 = std::operator<<(poVar3,local_9b8);
        poVar3 = std::operator<<(poVar3,"msg_type = TMessageType.EXCEPTION");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_9d8,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_9d8);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_9f8);
        poVar3 = std::operator<<(poVar3,local_9f8);
        poVar3 = std::operator<<(poVar3,
                                 "result = TApplicationException(TApplicationException.INTERNAL_ERROR, \'Internal error\')"
                                );
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string(local_9f8);
        std::__cxx11::string::~string((string *)&local_9d8);
        std::__cxx11::string::~string(local_9b8);
        std::__cxx11::string::~string((string *)&local_998);
        std::__cxx11::string::~string(local_978);
        std::__cxx11::string::~string((string *)&local_958);
        std::__cxx11::string::~string((string *)&local_938);
        std::__cxx11::string::~string(local_918);
        std::__cxx11::string::~string((string *)&local_8f8);
        std::__cxx11::string::~string(local_8d8);
        std::__cxx11::string::~string((string *)&local_8b8);
        std::__cxx11::string::~string(local_898);
        std::__cxx11::string::~string((string *)&local_878);
        std::__cxx11::string::~string((string *)&local_858);
      }
      bVar1 = t_function::is_oneway(local_20);
      if (!bVar1) {
        t_generator::indent_abi_cxx11_(&local_a78,&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_a78);
        poVar3 = std::operator<<(poVar3,"oprot.writeMessageBegin(\"");
        psVar4 = t_function::get_name_abi_cxx11_(local_20);
        poVar3 = std::operator<<(poVar3,(string *)psVar4);
        poVar3 = std::operator<<(poVar3,"\", msg_type, seqid)");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_a98,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_a98);
        poVar3 = std::operator<<(poVar3,"result.write(oprot)");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_ab8,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_ab8);
        poVar3 = std::operator<<(poVar3,"oprot.writeMessageEnd()");
        poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_ad8,&this->super_t_generator);
        poVar3 = std::operator<<(poVar3,(string *)&local_ad8);
        poVar3 = std::operator<<(poVar3,"oprot.trans.flush()");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_ad8);
        std::__cxx11::string::~string((string *)&local_ab8);
        std::__cxx11::string::~string((string *)&local_a98);
        std::__cxx11::string::~string((string *)&local_a78);
      }
      t_generator::indent_down(&this->super_t_generator);
    }
  }
  else {
    ptVar5 = t_function::get_arglist(local_20);
    f_iter._M_current = (t_field **)t_struct::get_members(ptVar5);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator(&local_180);
    t_generator::indent_abi_cxx11_((string *)local_1a0,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)local_1a0);
    poVar3 = std::operator<<(poVar3,"d = defer.maybeDeferred(self._handler.");
    psVar4 = t_function::get_name_abi_cxx11_(local_20);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    std::operator<<(poVar3,", ");
    std::__cxx11::string::~string((string *)local_1a0);
    local_1a1 = 1;
    local_1b0 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
    local_180._M_current = local_1b0;
    while( true ) {
      local_1b8._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_180,&local_1b8);
      if (!bVar1) break;
      if ((local_1a1 & 1) == 0) {
        std::operator<<((ostream *)&this->f_service_,", ");
      }
      else {
        local_1a1 = 0;
      }
      poVar3 = std::operator<<((ostream *)&this->f_service_,"args.");
      pptVar7 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_180);
      psVar4 = t_field::get_name_abi_cxx11_(*pptVar7);
      std::operator<<(poVar3,(string *)psVar4);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_180);
    }
    poVar3 = std::operator<<((ostream *)&this->f_service_,")");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    bVar1 = t_function::is_oneway(local_20);
    if (bVar1) {
      t_generator::indent_abi_cxx11_(&local_1d8,&this->super_t_generator);
      poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_1d8);
      poVar3 = std::operator<<(poVar3,"d.addErrback(self.handle_exception_");
      psVar4 = t_function::get_name_abi_cxx11_(local_20);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,", seqid)");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_1f8,&this->super_t_generator);
      poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_1f8);
      poVar3 = std::operator<<(poVar3,"d.addCallback(self.write_results_success_");
      psVar4 = t_function::get_name_abi_cxx11_(local_20);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,", result, seqid, oprot)");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_218,&this->super_t_generator);
      poVar3 = std::operator<<(poVar3,(string *)&local_218);
      poVar3 = std::operator<<(poVar3,"d.addErrback(self.write_results_exception_");
      psVar4 = t_function::get_name_abi_cxx11_(local_20);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,", result, seqid, oprot)");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    t_generator::indent_abi_cxx11_(&local_238,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_238);
    poVar3 = std::operator<<(poVar3,"return d");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_238);
    t_generator::indent_down(&this->super_t_generator);
    bVar1 = t_function::is_oneway(local_20);
    if (bVar1) {
      poVar3 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_service_);
      poVar3 = std::operator<<(poVar3,"def handle_exception_");
      psVar4 = t_function::get_name_abi_cxx11_(local_20);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,"(self, error, seqid):");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
    else {
      poVar3 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_service_);
      poVar3 = std::operator<<(poVar3,"def write_results_success_");
      psVar4 = t_function::get_name_abi_cxx11_(local_20);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,"(self, success, result, seqid, oprot):");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up(&this->super_t_generator);
      ptVar6 = t_function::get_returntype(local_20);
      uVar2 = (*(ptVar6->super_t_doc)._vptr_t_doc[4])();
      if ((uVar2 & 1) == 0) {
        t_generator::indent_abi_cxx11_(&local_258,&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_258);
        poVar3 = std::operator<<(poVar3,"result.success = success");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_258);
      }
      t_generator::indent_abi_cxx11_(&local_278,&this->super_t_generator);
      poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_278);
      poVar3 = std::operator<<(poVar3,"oprot.writeMessageBegin(\"");
      psVar4 = t_function::get_name_abi_cxx11_(local_20);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,"\", TMessageType.REPLY, seqid)");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_298,&this->super_t_generator);
      poVar3 = std::operator<<(poVar3,(string *)&local_298);
      poVar3 = std::operator<<(poVar3,"result.write(oprot)");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_2b8,&this->super_t_generator);
      poVar3 = std::operator<<(poVar3,(string *)&local_2b8);
      poVar3 = std::operator<<(poVar3,"oprot.writeMessageEnd()");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_2d8,&this->super_t_generator);
      poVar3 = std::operator<<(poVar3,(string *)&local_2d8);
      poVar3 = std::operator<<(poVar3,"oprot.trans.flush()");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_278);
      t_generator::indent_down(&this->super_t_generator);
      poVar3 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_service_);
      poVar3 = std::operator<<(poVar3,"def write_results_exception_");
      psVar4 = t_function::get_name_abi_cxx11_(local_20);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,"(self, error, result, seqid, oprot):");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
    t_generator::indent_up(&this->super_t_generator);
    bVar1 = t_function::is_oneway(local_20);
    if (!bVar1) {
      t_generator::indent_abi_cxx11_(&local_2f8,&this->super_t_generator);
      poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_2f8);
      poVar3 = std::operator<<(poVar3,"msg_type = TMessageType.REPLY");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2f8);
    }
    t_generator::indent_abi_cxx11_(&local_318,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_318);
    poVar3 = std::operator<<(poVar3,"try:");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_318);
    t_generator::indent_abi_cxx11_(&local_338,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_338);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_358);
    poVar3 = std::operator<<(poVar3,local_358);
    poVar3 = std::operator<<(poVar3,"error.raiseException()");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string(local_358);
    std::__cxx11::string::~string((string *)&local_338);
    bVar1 = t_function::is_oneway(local_20);
    if (!bVar1) {
      local_360 = (t_field **)
                  std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(x_iter._M_current);
      local_148._M_current = local_360;
      while( true ) {
        xname = (string *)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                          ((vector<t_field_*,_std::allocator<t_field_*>_> *)x_iter._M_current);
        bVar1 = __gnu_cxx::operator!=
                          (&local_148,
                           (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                            *)&xname);
        if (!bVar1) break;
        pptVar7 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_148);
        local_370 = t_field::get_name_abi_cxx11_(*pptVar7);
        t_generator::indent_abi_cxx11_(&local_390,&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_390);
        poVar3 = std::operator<<(poVar3,"except ");
        pptVar7 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_148);
        ptVar6 = t_field::get_type(*pptVar7);
        type_name_abi_cxx11_(&local_3b0,this,ptVar6);
        poVar3 = std::operator<<(poVar3,(string *)&local_3b0);
        poVar3 = std::operator<<(poVar3," as ");
        poVar3 = std::operator<<(poVar3,(string *)local_370);
        poVar3 = std::operator<<(poVar3,":");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_390);
        t_generator::indent_up(&this->super_t_generator);
        t_generator::indent_abi_cxx11_(&local_3d0,&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_3d0);
        poVar3 = std::operator<<(poVar3,"result.");
        poVar3 = std::operator<<(poVar3,(string *)local_370);
        poVar3 = std::operator<<(poVar3," = ");
        poVar3 = std::operator<<(poVar3,(string *)local_370);
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_3d0);
        t_generator::indent_down(&this->super_t_generator);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_148);
      }
    }
    t_generator::indent_abi_cxx11_(&local_3f0,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_3f0);
    poVar3 = std::operator<<(poVar3,"except TTransport.TTransportException:");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_410,&this->super_t_generator);
    poVar3 = std::operator<<(poVar3,(string *)&local_410);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_430);
    poVar3 = std::operator<<(poVar3,local_430);
    poVar3 = std::operator<<(poVar3,"raise");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string(local_430);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_3f0);
    bVar1 = t_function::is_oneway(local_20);
    if (bVar1) {
      t_generator::indent_abi_cxx11_(&local_690,&this->super_t_generator);
      poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_690);
      poVar3 = std::operator<<(poVar3,"except Exception:");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_6b0,&this->super_t_generator);
      poVar3 = std::operator<<(poVar3,(string *)&local_6b0);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(&arg_struct_1);
      poVar3 = std::operator<<(poVar3,(string *)&arg_struct_1);
      poVar3 = std::operator<<(poVar3,"logging.exception(\'Exception in oneway handler\')");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&arg_struct_1);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::__cxx11::string::~string((string *)&local_690);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_450,&this->super_t_generator);
      poVar3 = std::operator<<((ostream *)&this->f_service_,(string *)&local_450);
      poVar3 = std::operator<<(poVar3,"except TApplicationException as ex:");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_470,&this->super_t_generator);
      poVar3 = std::operator<<(poVar3,(string *)&local_470);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_490);
      poVar3 = std::operator<<(poVar3,local_490);
      poVar3 = std::operator<<(poVar3,"logging.exception(\'TApplication exception in handler\')");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_4b0,&this->super_t_generator);
      poVar3 = std::operator<<(poVar3,(string *)&local_4b0);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_4d0);
      poVar3 = std::operator<<(poVar3,local_4d0);
      poVar3 = std::operator<<(poVar3,"msg_type = TMessageType.EXCEPTION");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_4f0,&this->super_t_generator);
      poVar3 = std::operator<<(poVar3,(string *)&local_4f0);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_510);
      poVar3 = std::operator<<(poVar3,local_510);
      poVar3 = std::operator<<(poVar3,"result = ex");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_530,&this->super_t_generator);
      poVar3 = std::operator<<(poVar3,(string *)&local_530);
      poVar3 = std::operator<<(poVar3,"except Exception:");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_550,&this->super_t_generator);
      poVar3 = std::operator<<(poVar3,(string *)&local_550);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_570);
      poVar3 = std::operator<<(poVar3,local_570);
      poVar3 = std::operator<<(poVar3,"logging.exception(\'Unexpected exception in handler\')");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_590,&this->super_t_generator);
      poVar3 = std::operator<<(poVar3,(string *)&local_590);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_5b0);
      poVar3 = std::operator<<(poVar3,local_5b0);
      poVar3 = std::operator<<(poVar3,"msg_type = TMessageType.EXCEPTION");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_5d0,&this->super_t_generator);
      poVar3 = std::operator<<(poVar3,(string *)&local_5d0);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_5f0);
      poVar3 = std::operator<<(poVar3,local_5f0);
      poVar3 = std::operator<<(poVar3,
                               "result = TApplicationException(TApplicationException.INTERNAL_ERROR, \'Internal error\')"
                              );
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_610,&this->super_t_generator);
      poVar3 = std::operator<<(poVar3,(string *)&local_610);
      poVar3 = std::operator<<(poVar3,"oprot.writeMessageBegin(\"");
      psVar4 = t_function::get_name_abi_cxx11_(local_20);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,"\", msg_type, seqid)");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_630,&this->super_t_generator);
      poVar3 = std::operator<<(poVar3,(string *)&local_630);
      poVar3 = std::operator<<(poVar3,"result.write(oprot)");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_650,&this->super_t_generator);
      poVar3 = std::operator<<(poVar3,(string *)&local_650);
      poVar3 = std::operator<<(poVar3,"oprot.writeMessageEnd()");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_670,&this->super_t_generator);
      poVar3 = std::operator<<(poVar3,(string *)&local_670);
      poVar3 = std::operator<<(poVar3,"oprot.trans.flush()");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_670);
      std::__cxx11::string::~string((string *)&local_650);
      std::__cxx11::string::~string((string *)&local_630);
      std::__cxx11::string::~string((string *)&local_610);
      std::__cxx11::string::~string(local_5f0);
      std::__cxx11::string::~string((string *)&local_5d0);
      std::__cxx11::string::~string(local_5b0);
      std::__cxx11::string::~string((string *)&local_590);
      std::__cxx11::string::~string(local_570);
      std::__cxx11::string::~string((string *)&local_550);
      std::__cxx11::string::~string((string *)&local_530);
      std::__cxx11::string::~string(local_510);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::__cxx11::string::~string(local_4d0);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string(local_490);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)&local_450);
    }
    t_generator::indent_down(&this->super_t_generator);
  }
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)(resultname.field_2._M_local_buf + 8));
  return;
}

Assistant:

void t_py_generator::generate_process_function(t_service* tservice, t_function* tfunction) {
  (void)tservice;
  // Open function
  if (gen_tornado_) {
    f_service_ << indent() << "@gen.coroutine" << endl << indent() << "def process_"
               << tfunction->get_name() << "(self, seqid, iprot, oprot):" << endl;
  } else {
    f_service_ << indent() << "def process_" << tfunction->get_name()
               << "(self, seqid, iprot, oprot):" << endl;
  }

  indent_up();

  string argsname = tfunction->get_name() + "_args";
  string resultname = tfunction->get_name() + "_result";

  f_service_ << indent() << "args = " << argsname << "()" << endl << indent() << "args.read(iprot)"
             << endl << indent() << "iprot.readMessageEnd()" << endl;

  t_struct* xs = tfunction->get_xceptions();
  const std::vector<t_field*>& xceptions = xs->get_members();
  vector<t_field*>::const_iterator x_iter;

  // Declare result for non oneway function
  if (!tfunction->is_oneway()) {
    f_service_ << indent() << "result = " << resultname << "()" << endl;
  }

  if (gen_twisted_) {
    // Generate the function call
    t_struct* arg_struct = tfunction->get_arglist();
    const std::vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator f_iter;

    f_service_ << indent() << "d = defer.maybeDeferred(self._handler." << tfunction->get_name()
               << ", ";
    bool first = true;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      if (first) {
        first = false;
      } else {
        f_service_ << ", ";
      }
      f_service_ << "args." << (*f_iter)->get_name();
    }
    f_service_ << ")" << endl;

    if (tfunction->is_oneway()) {
      f_service_ << indent() << "d.addErrback(self.handle_exception_" << tfunction->get_name()
                 << ", seqid)" << endl;
    } else {
      f_service_ << indent() << "d.addCallback(self.write_results_success_" << tfunction->get_name()
                 << ", result, seqid, oprot)" << endl
                 << indent() << "d.addErrback(self.write_results_exception_"
                 << tfunction->get_name() << ", result, seqid, oprot)" << endl;
    }
    f_service_ << indent() << "return d" << endl << endl;

    indent_down();

    if (tfunction->is_oneway()) {
      indent(f_service_) << "def handle_exception_" << tfunction->get_name()
                         << "(self, error, seqid):" << endl;
    } else {
      indent(f_service_) << "def write_results_success_" << tfunction->get_name()
                         << "(self, success, result, seqid, oprot):" << endl;
      indent_up();
      if (!tfunction->get_returntype()->is_void()) {
        f_service_ << indent() << "result.success = success" << endl;
      }
      f_service_ << indent() << "oprot.writeMessageBegin(\"" << tfunction->get_name()
                 << "\", TMessageType.REPLY, seqid)" << endl
                 << indent() << "result.write(oprot)" << endl
                 << indent() << "oprot.writeMessageEnd()" << endl
                 << indent() << "oprot.trans.flush()" << endl
                 << endl;
      indent_down();

      indent(f_service_) << "def write_results_exception_" << tfunction->get_name()
                         << "(self, error, result, seqid, oprot):" << endl;
    }
    indent_up();
    if (!tfunction->is_oneway()) {
      f_service_ << indent() << "msg_type = TMessageType.REPLY" << endl;
    }
    f_service_ << indent() << "try:" << endl;

    // Kinda absurd
    f_service_ << indent() << indent_str() << "error.raiseException()" << endl;
    if (!tfunction->is_oneway()) {
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        const string& xname = (*x_iter)->get_name();
        f_service_ << indent() << "except " << type_name((*x_iter)->get_type()) << " as " << xname
                   << ":" << endl;
        indent_up();
        f_service_ << indent() << "result." << xname << " = " << xname << endl;
        indent_down();
      }
    }
    f_service_ << indent() << "except TTransport.TTransportException:" << endl
               << indent() << indent_str() << "raise" << endl;
    if (!tfunction->is_oneway()) {
      f_service_ << indent() << "except TApplicationException as ex:" << endl
                 << indent() << indent_str()
                 << "logging.exception('TApplication exception in handler')" << endl
                 << indent() << indent_str() << "msg_type = TMessageType.EXCEPTION" << endl
                 << indent() << indent_str() << "result = ex" << endl
                 << indent() << "except Exception:" << endl
                 << indent() << indent_str()
                 << "logging.exception('Unexpected exception in handler')" << endl
                 << indent() << indent_str() << "msg_type = TMessageType.EXCEPTION" << endl
                 << indent() << indent_str()
                 << "result = TApplicationException(TApplicationException.INTERNAL_ERROR, "
                    "'Internal error')"
                 << endl
                 << indent() << "oprot.writeMessageBegin(\"" << tfunction->get_name()
                 << "\", msg_type, seqid)" << endl
                 << indent() << "result.write(oprot)" << endl
                 << indent() << "oprot.writeMessageEnd()" << endl
                 << indent() << "oprot.trans.flush()" << endl;
    } else {
      f_service_ << indent() << "except Exception:" << endl
                 << indent() << indent_str()
                 << "logging.exception('Exception in oneway handler')" << endl;
    }
    indent_down();

  } else if (gen_tornado_) {
    // Generate the function call
    t_struct* arg_struct = tfunction->get_arglist();
    const std::vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator f_iter;

    if (!tfunction->is_oneway()) {
      indent(f_service_) << "msg_type = TMessageType.REPLY" << endl;
    }
    f_service_ << indent() << "try:" << endl;
    indent_up();
    f_service_ << indent();
    if (!tfunction->is_oneway() && !tfunction->get_returntype()->is_void()) {
      f_service_ << "result.success = ";
    }
    f_service_ << "yield gen.maybe_future(self._handler." << tfunction->get_name() << "(";
    bool first = true;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      if (first) {
        first = false;
      } else {
        f_service_ << ", ";
      }
      f_service_ << "args." << (*f_iter)->get_name();
    }
    f_service_ << "))" << endl;

    indent_down();
    if (!tfunction->is_oneway()) {
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        const string& xname = (*x_iter)->get_name();
        f_service_ << indent() << "except " << type_name((*x_iter)->get_type()) << " as " << xname
                   << ":" << endl
                   << indent() << indent_str() << "result." << xname << " = " << xname << endl;
      }
    }
    f_service_ << indent() << "except TTransport.TTransportException:" << endl
               << indent() << indent_str() << "raise" << endl;
    if (!tfunction->is_oneway()) {
      f_service_ << indent() << "except TApplicationException as ex:" << endl
                 << indent() << indent_str()
                 << "logging.exception('TApplication exception in handler')" << endl
                 << indent() << indent_str() << "msg_type = TMessageType.EXCEPTION" << endl
                 << indent() << indent_str() << "result = ex" << endl
                 << indent() << "except Exception:" << endl
                 << indent() << indent_str()
                 << "logging.exception('Unexpected exception in handler')" << endl
                 << indent() << indent_str() << "msg_type = TMessageType.EXCEPTION" << endl
                 << indent() << indent_str()
                 << "result = TApplicationException(TApplicationException.INTERNAL_ERROR, "
                    "'Internal error')"
                 << endl;
    } else {
      f_service_ << indent() << "except Exception:" << endl
                 << indent() << indent_str()
                 << "logging.exception('Exception in oneway handler')" << endl;
    }

    if (!tfunction->is_oneway()) {
      f_service_ << indent() << "oprot.writeMessageBegin(\"" << tfunction->get_name()
                 << "\", msg_type, seqid)" << endl
                 << indent() << "result.write(oprot)" << endl
                 << indent() << "oprot.writeMessageEnd()" << endl
                 << indent() << "oprot.trans.flush()" << endl;
    }

    // Close function
    indent_down();

  } else { // py
    // Try block for a function with exceptions
    // It also catches arbitrary exceptions raised by handler method to propagate them to the client
    f_service_ << indent() << "try:" << endl;
    indent_up();

    // Generate the function call
    t_struct* arg_struct = tfunction->get_arglist();
    const std::vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator f_iter;

    f_service_ << indent();
    if (!tfunction->is_oneway() && !tfunction->get_returntype()->is_void()) {
      f_service_ << "result.success = ";
    }
    f_service_ << "self._handler." << tfunction->get_name() << "(";
    bool first = true;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      if (first) {
        first = false;
      } else {
        f_service_ << ", ";
      }
      f_service_ << "args." << (*f_iter)->get_name();
    }
    f_service_ << ")" << endl;
    if (!tfunction->is_oneway()) {
      f_service_ << indent() << "msg_type = TMessageType.REPLY" << endl;
    }

    indent_down();
    f_service_ << indent()
               << "except TTransport.TTransportException:" << endl
               << indent() << indent_str() << "raise" << endl;

    if (!tfunction->is_oneway()) {
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        const string& xname = (*x_iter)->get_name();
        f_service_ << indent() << "except " << type_name((*x_iter)->get_type()) << " as " << xname
                   << ":" << endl;
        indent_up();
        f_service_ << indent() << "msg_type = TMessageType.REPLY" << endl;
        f_service_ << indent() << "result." << xname << " = " << xname << endl;
        indent_down();
      }

      f_service_ << indent() << "except TApplicationException as ex:" << endl
                 << indent() << indent_str()
                 << "logging.exception('TApplication exception in handler')" << endl
                 << indent() << indent_str() << "msg_type = TMessageType.EXCEPTION" << endl
                 << indent() << indent_str() << "result = ex" << endl
                 << indent() << "except Exception:" << endl
                 << indent() << indent_str()
                 << "logging.exception('Unexpected exception in handler')" << endl
                 << indent() << indent_str() << "msg_type = TMessageType.EXCEPTION" << endl
                 << indent() << indent_str()
                 << "result = TApplicationException(TApplicationException.INTERNAL_ERROR, "
                    "'Internal error')"
                 << endl
                 << indent() << "oprot.writeMessageBegin(\"" << tfunction->get_name()
                 << "\", msg_type, seqid)" << endl
                 << indent() << "result.write(oprot)" << endl
                 << indent() << "oprot.writeMessageEnd()" << endl
                 << indent() << "oprot.trans.flush()" << endl;
    } else {
      f_service_ << indent() << "except Exception:" << endl
                 << indent() << indent_str() << "logging.exception('Exception in oneway handler')" << endl;
    }

    // Close function
    indent_down();
  }
}